

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtag_fsm.cpp
# Opt level: O0

State Jtag_fsm::getTransition(State state,bool tms)

{
  State SStack_c;
  bool tms_local;
  State state_local;
  
  switch(state) {
  case TEST_LOGIC_RESET:
    SStack_c = (State)!tms;
    break;
  case RUN_TEST_IDLE:
    SStack_c = RUN_TEST_IDLE;
    if (tms) {
      SStack_c = SELECT_DR_SCAN;
    }
    break;
  case SELECT_DR_SCAN:
    SStack_c = CAPTURE_DR;
    if (tms) {
      SStack_c = SELECT_IR_SCAN;
    }
    break;
  case CAPTURE_DR:
    SStack_c = SHIFT_DR;
    if (tms) {
      SStack_c = EXIT1_DR;
    }
    break;
  case SHIFT_DR:
    SStack_c = SHIFT_DR;
    if (tms) {
      SStack_c = EXIT1_DR;
    }
    break;
  case EXIT1_DR:
    SStack_c = PAUSE_DR;
    if (tms) {
      SStack_c = UPDATE_DR;
    }
    break;
  case PAUSE_DR:
    SStack_c = PAUSE_DR;
    if (tms) {
      SStack_c = EXIT2_DR;
    }
    break;
  case EXIT2_DR:
    SStack_c = SHIFT_DR;
    if (tms) {
      SStack_c = UPDATE_DR;
    }
    break;
  case UPDATE_DR:
    SStack_c = RUN_TEST_IDLE;
    if (tms) {
      SStack_c = SELECT_DR_SCAN;
    }
    break;
  case SELECT_IR_SCAN:
    SStack_c = CAPTURE_IR;
    if (tms) {
      SStack_c = TEST_LOGIC_RESET;
    }
    break;
  case CAPTURE_IR:
    SStack_c = SHIFT_IR;
    if (tms) {
      SStack_c = EXIT1_IR;
    }
    break;
  case SHIFT_IR:
    SStack_c = SHIFT_IR;
    if (tms) {
      SStack_c = EXIT1_IR;
    }
    break;
  case EXIT1_IR:
    SStack_c = PAUSE_IR;
    if (tms) {
      SStack_c = UPDATE_IR;
    }
    break;
  case PAUSE_IR:
    SStack_c = PAUSE_IR;
    if (tms) {
      SStack_c = EXIT2_IR;
    }
    break;
  case EXIT2_IR:
    SStack_c = SHIFT_IR;
    if (tms) {
      SStack_c = UPDATE_IR;
    }
    break;
  case UPDATE_IR:
    SStack_c = RUN_TEST_IDLE;
    if (tms) {
      SStack_c = SELECT_DR_SCAN;
    }
    break;
  default:
    SStack_c = TEST_LOGIC_RESET;
  }
  return SStack_c;
}

Assistant:

Jtag_fsm::State Jtag_fsm::getTransition(State state, bool tms) {
	switch (state) {
	case TEST_LOGIC_RESET:
		return tms ? TEST_LOGIC_RESET : RUN_TEST_IDLE;
	case RUN_TEST_IDLE:
		return tms ? SELECT_DR_SCAN : RUN_TEST_IDLE;
	case SELECT_DR_SCAN:
		return tms ? SELECT_IR_SCAN : CAPTURE_DR;
	case CAPTURE_DR:
		return tms ? EXIT1_DR : SHIFT_DR;
	case SHIFT_DR:
		return tms ? EXIT1_DR : SHIFT_DR;
	case EXIT1_DR:
		return tms ? UPDATE_DR : PAUSE_DR;
	case PAUSE_DR:
		return tms ? EXIT2_DR : PAUSE_DR;
	case EXIT2_DR:
		return tms ? UPDATE_DR : SHIFT_DR;
	case UPDATE_DR:
		return tms ? SELECT_DR_SCAN : RUN_TEST_IDLE;
	case SELECT_IR_SCAN:
		return tms ? TEST_LOGIC_RESET : CAPTURE_IR;
	case CAPTURE_IR:
		return tms ? EXIT1_IR : SHIFT_IR;
	case SHIFT_IR:
		return tms ? EXIT1_IR : SHIFT_IR;
	case EXIT1_IR:
		return tms ? UPDATE_IR : PAUSE_IR;
	case PAUSE_IR:
		return tms ? EXIT2_IR : PAUSE_IR;
	case EXIT2_IR:
		return tms ? UPDATE_IR : SHIFT_IR;
	case UPDATE_IR:
		return tms ? SELECT_DR_SCAN : RUN_TEST_IDLE;
	}

	return TEST_LOGIC_RESET;
}